

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsValidation.cpp
# Opt level: O1

bool __thiscall
chrono::utils::ChValidation::Process
          (ChValidation *this,string *sim_filename,string *ref_filename,char delim)

{
  Data *data;
  Data *data_00;
  ulong uVar1;
  double dVar2;
  pointer pvVar3;
  pointer pvVar4;
  double *pdVar5;
  ulong uVar6;
  size_t sVar7;
  double *pdVar8;
  void *pvVar9;
  ulong *puVar10;
  size_t sVar11;
  long lVar12;
  ulong uVar13;
  char *pcVar14;
  ulong uVar15;
  ostream *poVar16;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 in_XMM3 [16];
  
  data = &this->m_sim_data;
  sVar7 = ReadDataFile(sim_filename,delim,&this->m_sim_headers,data);
  this->m_num_rows = sVar7;
  this->m_num_cols =
       (long)(this->m_sim_headers).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish -
       (long)(this->m_sim_headers).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start >> 5;
  data_00 = &this->m_ref_data;
  sVar7 = ReadDataFile(ref_filename,delim,&this->m_ref_headers,data_00);
  if ((this->m_L2_norms)._M_size != 0) {
    operator_delete((this->m_L2_norms)._M_data);
    (this->m_L2_norms)._M_size = 0;
    pdVar8 = (double *)::operator_new(0);
    (this->m_L2_norms)._M_data = pdVar8;
  }
  if ((this->m_RMS_norms)._M_size != 0) {
    operator_delete((this->m_RMS_norms)._M_data);
    (this->m_RMS_norms)._M_size = 0;
    pdVar8 = (double *)::operator_new(0);
    (this->m_RMS_norms)._M_data = pdVar8;
  }
  if ((this->m_INF_norms)._M_size != 0) {
    operator_delete((this->m_INF_norms)._M_data);
    (this->m_INF_norms)._M_size = 0;
    pdVar8 = (double *)::operator_new(0);
    (this->m_INF_norms)._M_data = pdVar8;
  }
  if (this->m_num_cols ==
      (long)(this->m_ref_headers).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)(this->m_ref_headers).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start >> 5) {
    if (this->m_num_rows == sVar7) {
      pvVar3 = (data->
               super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pvVar4 = (data_00->
               super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      sVar7 = pvVar3->_M_size;
      pvVar9 = ::operator_new(sVar7 * 8);
      auVar18 = ZEXT816(0) << 0x40;
      if (sVar7 != 0) {
        pdVar8 = pvVar3->_M_data;
        pdVar5 = pvVar4->_M_data;
        sVar11 = 0;
        do {
          *(double *)((long)pvVar9 + sVar11 * 8) = pdVar8[sVar11] - pdVar5[sVar11];
          sVar11 = sVar11 + 1;
        } while (sVar7 != sVar11);
        dVar17 = *(double *)((long)pvVar9 + sVar7 * 8 + -8);
        dVar17 = dVar17 * dVar17;
        for (; auVar18._8_8_ = 0, auVar18._0_8_ = dVar17, sVar7 != 1; sVar7 = sVar7 - 1) {
          dVar2 = *(double *)((long)pvVar9 + sVar7 * 8 + -0x10);
          dVar17 = dVar17 + dVar2 * dVar2;
        }
      }
      if (auVar18._0_8_ < 0.0) {
        dVar17 = sqrt(auVar18._0_8_);
      }
      else {
        auVar18 = vsqrtsd_avx(auVar18,auVar18);
        dVar17 = auVar18._0_8_;
      }
      operator_delete(pvVar9);
      if (dVar17 <= 1e-10) {
        sVar11 = this->m_num_cols;
        sVar7 = sVar11 - 1;
        if ((this->m_L2_norms)._M_size != sVar7) {
          operator_delete((this->m_L2_norms)._M_data);
          (this->m_L2_norms)._M_size = sVar7;
          pdVar8 = (double *)::operator_new(sVar7 * 8);
          (this->m_L2_norms)._M_data = pdVar8;
        }
        if (sVar7 != 0) {
          memset((this->m_L2_norms)._M_data,0,sVar11 * 8 - 8);
        }
        sVar11 = this->m_num_cols;
        sVar7 = sVar11 - 1;
        if ((this->m_RMS_norms)._M_size != sVar7) {
          operator_delete((this->m_RMS_norms)._M_data);
          (this->m_RMS_norms)._M_size = sVar7;
          pdVar8 = (double *)::operator_new(sVar7 * 8);
          (this->m_RMS_norms)._M_data = pdVar8;
        }
        if (sVar7 != 0) {
          memset((this->m_RMS_norms)._M_data,0,sVar11 * 8 - 8);
        }
        sVar11 = this->m_num_cols;
        sVar7 = sVar11 - 1;
        if ((this->m_INF_norms)._M_size != sVar7) {
          operator_delete((this->m_INF_norms)._M_data);
          (this->m_INF_norms)._M_size = sVar7;
          pdVar8 = (double *)::operator_new(sVar7 * 8);
          (this->m_INF_norms)._M_data = pdVar8;
        }
        if (sVar7 != 0) {
          memset((this->m_INF_norms)._M_data,0,sVar11 * 8 - 8);
        }
        if (this->m_num_cols == 1) {
          return true;
        }
        uVar13 = 0;
        do {
          uVar1 = uVar13 + 1;
          pvVar3 = (data->
                   super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pvVar4 = (data_00->
                   super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          sVar7 = pvVar3[uVar1]._M_size;
          pvVar9 = ::operator_new(sVar7 * 8);
          auVar19 = ZEXT816(0) << 0x40;
          if (sVar7 != 0) {
            pdVar8 = pvVar3[uVar1]._M_data;
            pdVar5 = pvVar4[uVar1]._M_data;
            sVar11 = 0;
            do {
              *(double *)((long)pvVar9 + sVar11 * 8) = pdVar8[sVar11] - pdVar5[sVar11];
              sVar11 = sVar11 + 1;
            } while (sVar7 != sVar11);
            dVar17 = *(double *)((long)pvVar9 + sVar7 * 8 + -8);
            dVar17 = dVar17 * dVar17;
            for (; auVar19._8_8_ = 0, auVar19._0_8_ = dVar17, sVar7 != 1; sVar7 = sVar7 - 1) {
              dVar2 = *(double *)((long)pvVar9 + sVar7 * 8 + -0x10);
              dVar17 = dVar17 + dVar2 * dVar2;
            }
          }
          if (auVar19._0_8_ < 0.0) {
            dVar17 = sqrt(auVar19._0_8_);
          }
          else {
            auVar18 = vsqrtsd_avx(auVar19,auVar19);
            dVar17 = auVar18._0_8_;
          }
          (this->m_L2_norms)._M_data[uVar13] = dVar17;
          operator_delete(pvVar9);
          pvVar3 = (this->m_sim_data).
                   super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar4 = (this->m_ref_data).
                   super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          sVar7 = pvVar3[uVar1]._M_size;
          pvVar9 = ::operator_new(sVar7 * 8);
          if (sVar7 == 0) {
            auVar20 = SUB6416(ZEXT864(0),0) << 0x40;
          }
          else {
            pdVar8 = pvVar3[uVar1]._M_data;
            pdVar5 = pvVar4[uVar1]._M_data;
            sVar11 = 0;
            do {
              *(double *)((long)pvVar9 + sVar11 * 8) = pdVar8[sVar11] - pdVar5[sVar11];
              sVar11 = sVar11 + 1;
            } while (sVar7 != sVar11);
            dVar17 = *(double *)((long)pvVar9 + sVar7 * 8 + -8);
            dVar17 = dVar17 * dVar17;
            for (sVar11 = sVar7; auVar20._8_8_ = 0, auVar20._0_8_ = dVar17, sVar11 != 1;
                sVar11 = sVar11 - 1) {
              dVar2 = *(double *)((long)pvVar9 + sVar11 * 8 + -0x10);
              dVar17 = dVar17 + dVar2 * dVar2;
            }
          }
          auVar18 = vcvtusi2sd_avx512f(in_XMM3,sVar7);
          auVar21._0_8_ = auVar20._0_8_ / auVar18._0_8_;
          auVar21._8_8_ = auVar20._8_8_;
          if (auVar21._0_8_ < 0.0) {
            dVar17 = sqrt(auVar21._0_8_);
          }
          else {
            auVar18 = vsqrtsd_avx(auVar21,auVar21);
            dVar17 = auVar18._0_8_;
          }
          (this->m_RMS_norms)._M_data[uVar13] = dVar17;
          operator_delete(pvVar9);
          pvVar3 = (this->m_sim_data).
                   super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar4 = (this->m_ref_data).
                   super__Vector_base<std::valarray<double>,_std::allocator<std::valarray<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar6 = pvVar3[uVar1]._M_size;
          puVar10 = (ulong *)::operator_new(uVar6 * 8);
          if (uVar6 == 0) {
            auVar18 = ZEXT816(0) << 0x40;
          }
          else {
            pdVar8 = pvVar3[uVar1]._M_data;
            pdVar5 = pvVar4[uVar1]._M_data;
            uVar15 = 0;
            auVar24._8_8_ = 0x7fffffffffffffff;
            auVar24._0_8_ = 0x7fffffffffffffff;
            do {
              puVar10[uVar15] = (ulong)(pdVar8[uVar15] - pdVar5[uVar15]);
              uVar15 = uVar15 + 1;
            } while (uVar6 != uVar15);
            auVar22._8_8_ = 0;
            auVar22._0_8_ = *puVar10;
            auVar18 = vandpd_avx(auVar22,auVar24);
          }
          auVar25._8_8_ = 0x7fffffffffffffff;
          auVar25._0_8_ = 0x7fffffffffffffff;
          dVar17 = auVar18._0_8_;
          if (1 < uVar6) {
            uVar15 = 1;
            do {
              auVar23._8_8_ = 0;
              auVar23._0_8_ = puVar10[uVar15];
              auVar19 = vandpd_avx(auVar23,auVar25);
              auVar18 = vmaxsd_avx(auVar19,auVar18);
              dVar17 = auVar18._0_8_;
              uVar15 = uVar15 + 1;
            } while (uVar6 != uVar15);
          }
          (this->m_INF_norms)._M_data[uVar13] = dVar17;
          operator_delete(puVar10);
          uVar13 = uVar1;
        } while (uVar1 < this->m_num_cols - 1);
        return true;
      }
      poVar16 = (ostream *)&std::cout;
      pcVar14 = "ERROR: time sequences do not match.";
      lVar12 = 0x23;
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ERROR: the number of rows in the two files is different:",
                 0x38);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
      std::ostream::put(-0x20);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   File ",8);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(sim_filename->_M_dataplus)._M_p,
                           sim_filename->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," has ",5);
      poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," columns",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
      std::ostream::put((char)poVar16);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   File ",8);
      poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,(ref_filename->_M_dataplus)._M_p,
                           ref_filename->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar16," has ",5);
      poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
      lVar12 = 8;
      pcVar14 = " columns";
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"ERROR: the number of columns in the two files is different:",
               0x3b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
    std::ostream::put(-0x20);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   File ",8);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(sim_filename->_M_dataplus)._M_p,
                         sim_filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," has ",5);
    poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," columns",8);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
    std::ostream::put((char)poVar16);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   File ",8);
    poVar16 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,(ref_filename->_M_dataplus)._M_p,
                         ref_filename->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," has ",5);
    poVar16 = std::ostream::_M_insert<unsigned_long>((ulong)poVar16);
    lVar12 = 8;
    pcVar14 = " columns";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar16,pcVar14,lVar12);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
  std::ostream::put((char)poVar16);
  std::ostream::flush();
  return false;
}

Assistant:

bool ChValidation::Process(const std::string& sim_filename,
                           const std::string& ref_filename,
                           char               delim)
{
  // Read the simulation results file.
  m_num_rows = ReadDataFile(sim_filename, delim, m_sim_headers, m_sim_data);
  m_num_cols = m_sim_headers.size();

  // Read the reference data file.
  size_t num_ref_rows = ReadDataFile(ref_filename, delim, m_ref_headers, m_ref_data);

  // Resize the arrays of norms to zero length
  // (needed if we return with an error below)
  m_L2_norms.resize(0);
  m_RMS_norms.resize(0);
  m_INF_norms.resize(0);

  // Perform some sanity checks.
  if (m_num_cols != m_ref_headers.size()) {
    std::cout << "ERROR: the number of columns in the two files is different:" << std::endl;
    std::cout << "   File " << sim_filename << " has " << m_num_cols << " columns" << std::endl;
    std::cout << "   File " << ref_filename << " has " << m_ref_headers.size() << " columns" << std::endl;
    return false;
  }

  if (m_num_rows != num_ref_rows) {
    std::cout << "ERROR: the number of rows in the two files is different:" << std::endl;
    std::cout << "   File " << sim_filename << " has " << m_num_rows << " columns" << std::endl;
    std::cout << "   File " << ref_filename << " has " << num_ref_rows << " columns" << std::endl;
    return false;
  }

  // Ensure that the first columns (time) are the same.
  if (L2norm(m_sim_data[0] - m_ref_data[0]) > 1e-10) {
    std::cout << "ERROR: time sequences do not match." << std::endl;
    return false;
  }

  // Resize arrays of norms.
  m_L2_norms.resize(m_num_cols - 1);
  m_RMS_norms.resize(m_num_cols - 1);
  m_INF_norms.resize(m_num_cols - 1);

  // Calculate norms of the differences.
  for (size_t col = 0; col < m_num_cols - 1; col++) {
    m_L2_norms[col] = L2norm(m_sim_data[col + 1] - m_ref_data[col + 1]);
    m_RMS_norms[col] = RMSnorm(m_sim_data[col + 1] - m_ref_data[col + 1]);
    m_INF_norms[col] = INFnorm(m_sim_data[col + 1] - m_ref_data[col + 1]);
  }

  return true;
}